

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

size_t intersect_accel<true,true,true>(Ray *ray,Accel *accel,TraversalStats *stats)

{
  Vec<float,_3UL> *pVVar1;
  float *pfVar2;
  float fVar3;
  Index IVar4;
  pointer pNVar5;
  pointer pPVar6;
  undefined1 auVar7 [16];
  byte bVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  Index IVar13;
  size_t sVar14;
  long lVar15;
  Index IVar16;
  ulong uVar17;
  Index IVar18;
  int iVar19;
  uint uVar20;
  size_t j;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  size_t local_208;
  undefined8 local_1f8;
  undefined4 local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  TraversalStats *local_1b8;
  Vec<float,_3UL> *local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  Type local_134 [64];
  uint local_34;
  
  auVar32._8_4_ = 0x3f800000;
  auVar32._0_8_ = 0x3f8000003f800000;
  auVar32._12_4_ = 0x3f800000;
  uVar17 = *(ulong *)(ray->dir).values;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar17;
  fVar25 = (ray->dir).values[2];
  local_1b0 = &ray->dir;
  local_208 = 0xffffffffffffffff;
  local_188 = 1.0 / fVar25;
  iVar19 = vextractps_avx(auVar36,1);
  uVar20 = vmovmskps_avx(ZEXT416((uint)fVar25));
  auVar32 = vdivps_avx(auVar32,auVar36);
  local_134[0] = (((accel->bvh).nodes.
                   super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->index).value;
  auVar23._8_4_ = 0x7fffffff;
  auVar23._0_8_ = 0x7fffffff7fffffff;
  auVar23._12_4_ = 0x7fffffff;
  auVar23 = vandps_avx512vl(auVar32,auVar23);
  auVar7._8_4_ = 0x7f800000;
  auVar7._0_8_ = 0x7f8000007f800000;
  auVar7._12_4_ = 0x7f800000;
  uVar9 = vpcmpd_avx512vl(auVar23,auVar7,1);
  local_158 = auVar32._0_4_;
  _local_148 = vmovshdup_avx(auVar32);
  bVar10 = (byte)((uVar9 & 0xf) >> 1);
  bVar8 = (byte)(uVar9 & 0xf);
  local_168._4_12_ = auVar32._4_12_;
  local_168._0_4_ =
       (uint)(bVar8 & 1) * ((int)local_158 + 2) + (uint)!(bool)(bVar8 & 1) * (int)local_158;
  local_178._4_12_ = local_148._4_12_;
  local_178._0_4_ =
       (uint)(bVar10 & 1) * (local_148._0_4_ + 2) + (uint)!(bool)(bVar10 & 1) * local_148._0_4_;
  local_34 = 1;
  iVar11 = (int)uVar17 >> 0x1f;
  local_198 = ZEXT416((uint)((uint)ABS(local_188) < 0x7f800000) * ((int)local_188 + 2) +
                      (uint)((uint)ABS(local_188) >= 0x7f800000) * (int)local_188);
  local_1d0 = (ulong)((-(iVar19 >> 0x1f) + 2U) * 4);
  local_1d8 = (ulong)(((uVar20 & 1) + 4) * 4);
  local_1c0 = (ulong)((-(iVar19 >> 0x1f) ^ 3U) << 2);
  local_1c8 = (ulong)((uVar20 & 1 ^ 5) << 2);
  local_1e0 = (ulong)(uint)(iVar11 * -4);
  local_1e8 = (ulong)((-iVar11 ^ 1U) << 2);
  local_1b8 = stats;
  fStack_184 = local_188;
  fStack_180 = local_188;
  fStack_17c = local_188;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  do {
    fVar25 = (ray->org).values[0];
    auVar26._4_4_ = fVar25;
    auVar26._0_4_ = fVar25;
    auVar26._8_4_ = fVar25;
    auVar26._12_4_ = fVar25;
    fVar24 = (ray->org).values[1];
    auVar29._4_4_ = fVar24;
    auVar29._0_4_ = fVar24;
    auVar29._8_4_ = fVar24;
    auVar29._12_4_ = fVar24;
    fVar28 = (ray->org).values[2];
    auVar31._4_4_ = fVar28;
    auVar31._0_4_ = fVar28;
    auVar31._8_4_ = fVar28;
    auVar31._12_4_ = fVar28;
    fVar3 = ray->tmin;
    auVar33._4_4_ = fVar3;
    auVar33._0_4_ = fVar3;
    auVar33._8_4_ = fVar3;
    auVar33._12_4_ = fVar3;
    fVar3 = ray->tmax;
    pNVar5 = (accel->bvh).nodes.
             super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar14 = local_1b8->visited_nodes;
LAB_00108303:
    local_34 = local_34 - 1;
    IVar18.value = local_134[local_34];
    uVar20 = IVar18.value & 0xf;
    if (uVar20 == 0) {
      do {
        uVar20 = IVar18.value >> 4;
        auVar32 = vminss_avx(ZEXT416((uint)(local_168._0_4_ *
                                           (*(float *)((long)(pNVar5 + uVar20) + local_1e8) - fVar25
                                           ))),ZEXT416((uint)fVar3));
        auVar32 = vminss_avx(ZEXT416((uint)(local_178._0_4_ *
                                           (*(float *)((long)(pNVar5 + uVar20) + local_1c0) - fVar24
                                           ))),auVar32);
        auVar7 = vminss_avx(ZEXT416((uint)(local_198._0_4_ *
                                          (*(float *)((long)(pNVar5 + uVar20) + local_1c8) - fVar28)
                                          )),auVar32);
        auVar32 = vinsertps_avx(ZEXT416(*(uint *)((long)(pNVar5 + uVar20) + local_1d8)),
                                ZEXT416(*(uint *)((long)(pNVar5 + (ulong)uVar20 + 1) + local_1d8)),
                                0x10);
        auVar23 = vminss_avx(ZEXT416((uint)(local_168._0_4_ *
                                           (*(float *)((long)(pNVar5 + (ulong)uVar20 + 1) +
                                                      local_1e8) - fVar25))),ZEXT416((uint)fVar3));
        auVar36 = vminss_avx(ZEXT416((uint)(local_178._0_4_ *
                                           (*(float *)((long)(pNVar5 + (ulong)uVar20 + 1) +
                                                      local_1c0) - fVar24))),auVar23);
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)((long)(pNVar5 + uVar20) + local_1e0)),
                                ZEXT416(*(uint *)((long)(pNVar5 + (ulong)uVar20 + 1) + local_1e0)),
                                0x10);
        auVar32 = vsubps_avx(auVar32,auVar31);
        auVar38._0_4_ = auVar32._0_4_ * local_188;
        auVar38._4_4_ = auVar32._4_4_ * fStack_184;
        auVar38._8_4_ = auVar32._8_4_ * fStack_180;
        auVar38._12_4_ = auVar32._12_4_ * fStack_17c;
        auVar36 = vminss_avx(ZEXT416((uint)(local_198._0_4_ *
                                           (*(float *)((long)(pNVar5 + (ulong)uVar20 + 1) +
                                                      local_1c8) - fVar28))),auVar36);
        auVar32 = vinsertps_avx(ZEXT416(*(uint *)((long)(pNVar5 + uVar20) + local_1d0)),
                                ZEXT416(*(uint *)((long)(pNVar5 + (ulong)uVar20 + 1) + local_1d0)),
                                0x10);
        auVar23 = vsubps_avx(auVar23,auVar26);
        auVar34._0_4_ = auVar23._0_4_ * local_158;
        auVar34._4_4_ = auVar23._4_4_ * fStack_154;
        auVar34._8_4_ = auVar23._8_4_ * fStack_150;
        auVar34._12_4_ = auVar23._12_4_ * fStack_14c;
        auVar32 = vsubps_avx(auVar32,auVar29);
        auVar37._0_4_ = auVar32._0_4_ * (float)local_148._0_4_;
        auVar37._4_4_ = auVar32._4_4_ * (float)local_148._4_4_;
        auVar37._8_4_ = auVar32._8_4_ * fStack_140;
        auVar37._12_4_ = auVar32._12_4_ * fStack_13c;
        auVar32 = vmaxps_avx(auVar34,auVar33);
        auVar32 = vmaxps_avx(auVar37,auVar32);
        auVar32 = vmaxps_avx(auVar38,auVar32);
        auVar23 = vmovshdup_avx(auVar32);
        fVar35 = auVar23._0_4_;
        if (auVar32._0_4_ <= auVar7._0_4_) {
          IVar18.value = ((Index *)((long)(pNVar5 + uVar20) + 0x18))->value;
          if (fVar35 <= auVar36._0_4_) {
            uVar17 = (ulong)local_34;
            if (0x3f < uVar17) {
              local_1b8->visited_nodes = sVar14 + 1;
              __assert_fail("!is_full()",
                            "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/stack.h"
                            ,0x15,
                            "void bvh::v2::SmallStack<bvh::v2::Index<32, 4>, 64>::push(const T &) [T = bvh::v2::Index<32, 4>, Capacity = 64]"
                           );
            }
            IVar4.value = ((Index *)((long)(pNVar5 + (ulong)uVar20 + 1) + 0x18))->value;
            IVar13.value = IVar4.value;
            IVar16.value = IVar18.value;
            if (auVar32._0_4_ <= fVar35) {
              IVar13.value = IVar18.value;
              IVar16.value = IVar4.value;
            }
            IVar18.value = IVar13.value;
            local_34 = local_34 + 1;
            local_134[uVar17] = IVar16.value;
          }
        }
        else {
          if (auVar36._0_4_ < fVar35) goto LAB_00108484;
          IVar18.value = ((Index *)((long)(pNVar5 + (ulong)uVar20 + 1) + 0x18))->value;
        }
        sVar14 = sVar14 + 1;
        uVar20 = IVar18.value & 0xf;
        if (uVar20 != 0) {
          local_1b8->visited_nodes = sVar14;
          break;
        }
      } while( true );
    }
    local_1b8->visited_leaves = local_1b8->visited_leaves + 1;
    sVar14 = (size_t)(IVar18.value >> 4);
    lVar21 = (ulong)(IVar18.value & 0xfffffff0) * 3 + 0x18;
    lVar22 = (ulong)(IVar18.value & 0xfffffff0) * 3 + 0xc;
    do {
      pPVar6 = (accel->tris).
               super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(ray->org).values;
      pVVar1 = &pPVar6[sVar14].n;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values;
      auVar23 = vsubps_avx(auVar27,auVar30);
      local_1a0 = (((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values[2] - (ray->org).values[2];
      local_1a8 = vmovlps_avx(auVar23);
      auVar32 = vmovshdup_avx(auVar23);
      fVar25 = (ray->dir).values[2];
      fVar24 = (ray->dir).values[0];
      fVar28 = (ray->dir).values[1];
      auVar7 = vfmsub231ss_fma(ZEXT416((uint)(auVar32._0_4_ * fVar25)),ZEXT416((uint)fVar28),
                               ZEXT416((uint)local_1a0));
      auVar36 = vfmsub231ss_fma(ZEXT416((uint)(local_1a0 * fVar24)),auVar23,ZEXT416((uint)fVar25));
      auVar23 = vfmsub231ss_fma(ZEXT416((uint)(auVar23._0_4_ * fVar28)),ZEXT416((uint)fVar24),
                                auVar32);
      auVar32 = vinsertps_avx(auVar7,auVar36,0x10);
      local_1f8 = vmovlps_avx(auVar32);
      local_1f0 = auVar23._0_4_;
      fVar24 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,pVVar1,pPVar6 + sVar14 + 1,local_1b0);
      fVar25 = 0.0;
      lVar15 = 0;
      do {
        pfVar2 = (float *)((long)&local_1f8 + lVar15);
        lVar12 = lVar15 + lVar21;
        lVar15 = lVar15 + 4;
        fVar25 = fVar25 + *pfVar2 * *(float *)((long)(pPVar6->p0).values + lVar12);
      } while (lVar15 != 0xc);
      fVar28 = 0.0;
      lVar15 = 0;
      do {
        pfVar2 = (float *)((long)&local_1f8 + lVar15);
        lVar12 = lVar15 + lVar22;
        lVar15 = lVar15 + 4;
        fVar28 = fVar28 + *pfVar2 * *(float *)((long)(pPVar6->p0).values + lVar12);
      } while (lVar15 != 0xc);
      fVar24 = 1.0 / fVar24;
      if (((-1.1920929e-07 <= fVar24 * fVar25) && (-1.1920929e-07 <= fVar24 * fVar28)) &&
         (-1.1920929e-07 <= (1.0 - fVar24 * fVar25) - fVar24 * fVar28)) {
        fVar25 = std::
                 transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                           (0,pVVar1,pPVar6 + sVar14 + 1,&local_1a8);
        fVar25 = fVar25 * fVar24;
        if ((ray->tmin <= fVar25) && (fVar25 <= ray->tmax)) {
          ray->tmax = fVar25;
          local_208 = sVar14;
        }
      }
      sVar14 = sVar14 + 1;
      lVar21 = lVar21 + 0x30;
      lVar22 = lVar22 + 0x30;
    } while (sVar14 != uVar20 + (IVar18.value >> 4));
    if (local_34 == 0) {
      return local_208;
    }
  } while( true );
LAB_00108484:
  sVar14 = sVar14 + 1;
  local_1b8->visited_nodes = sVar14;
  if (local_34 == 0) {
    return local_208;
  }
  goto LAB_00108303;
}

Assistant:

static size_t intersect_accel(Ray& ray, const Accel& accel, TraversalStats& stats) {
    size_t prim_id = invalid_id;
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    accel.bvh.intersect<false, UseRobustTraversal>(ray, accel.bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            if constexpr (CaptureStats)
                stats.visited_leaves++;
            for (size_t i = begin; i < end; ++i) {
                size_t j = PermutePrims ? i : accel.bvh.prim_ids[i];
                if (auto hit = accel.tris[j].intersect(ray)) {
                    ray.tmax = std::get<0>(*hit);
                    prim_id = j;
                }
            }
            return prim_id != invalid_id;
        },
        [&] (auto&&, auto&&) {
            if constexpr (CaptureStats)
                stats.visited_nodes++;
        });
    return prim_id;
}